

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O1

vector<CardType,_std::allocator<CardType>_> * __thiscall
Deck::populateDeck(vector<CardType,_std::allocator<CardType>_> *__return_storage_ptr__,Deck *this)

{
  iterator iVar1;
  pointer pCVar2;
  pointer pCVar3;
  int *piVar4;
  int iVar5;
  CardType local_3c [3];
  
  (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (2 < *this->deckSize) {
    iVar5 = 0;
    do {
      local_3c[2] = 0;
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<CardType,_std::allocator<CardType>_>::_M_realloc_insert<CardType>
                  (__return_storage_ptr__,iVar1,local_3c + 2);
      }
      else {
        *iVar1._M_current = INFANTRY;
        (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      local_3c[1] = 1;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<CardType,_std::allocator<CardType>_>::_M_realloc_insert<CardType>
                  (__return_storage_ptr__,iVar1,local_3c + 1);
      }
      else {
        *iVar1._M_current = ARTILLERY;
        (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      local_3c[0] = CAVALRY;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<CardType,_std::allocator<CardType>_>::_M_realloc_insert<CardType>
                  (__return_storage_ptr__,iVar1,local_3c);
      }
      else {
        *iVar1._M_current = CAVALRY;
        (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < *this->deckSize / 3);
  }
  pCVar2 = (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl
           .super__Vector_impl_data._M_start;
  pCVar3 = (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  piVar4 = (int *)operator_new(4);
  *piVar4 = (int)((ulong)((long)pCVar3 - (long)pCVar2) >> 2);
  this->deckSize = piVar4;
  return __return_storage_ptr__;
}

Assistant:

std::vector<CardType> Deck::populateDeck() {
    std::vector<CardType> deck = {};

    for (int i = 0; i < *Deck::getNumberOfCards() / 3; i++) {
        deck.emplace_back(CardType::INFANTRY);
        deck.emplace_back(CardType::ARTILLERY);
        deck.emplace_back(CardType::CAVALRY);
    }

    Deck::setNumberOfCards(deck.size());

    return deck;
}